

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void __thiscall pbrt::IPCChannel::Connect(IPCChannel *this)

{
  int iVar1;
  int *piVar2;
  addrinfo *paVar3;
  int vb;
  undefined4 uStack_ac;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  addrinfo *addrinfo;
  addrinfo hints;
  
  hints.ai_flags = this->socketFd;
  vb = 0xffffffff;
  if (hints.ai_flags != -1) {
    LogFatal<char_const(&)[9],char_const(&)[5],char_const(&)[9],int&,char_const(&)[5],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
               ,0x6d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])"socketFd",
               (char (*) [5])0x60fed8,(char (*) [9])"socketFd",&hints.ai_flags,
               (char (*) [5])0x60fed8,&vb);
  }
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
        ,0x6f,"Trying to connect to display server");
  }
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_flags = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_family = 0;
  hints.ai_socktype = 1;
  iVar1 = getaddrinfo((this->address)._M_dataplus._M_p,(this->port)._M_dataplus._M_p,
                      (addrinfo *)&hints,(addrinfo **)&addrinfo);
  if (iVar1 != 0) {
    _vb = gai_strerror(iVar1);
    ErrorExit<char_const*>("%s",(char **)&vb);
  }
  this->socketFd = -1;
  if (addrinfo == (addrinfo *)0x0) {
    addrinfo = (addrinfo *)0x0;
  }
  else {
    paVar3 = addrinfo;
    do {
      iVar1 = socket(paVar3->ai_family,paVar3->ai_socktype,paVar3->ai_protocol);
      this->socketFd = iVar1;
      if (iVar1 == -1) {
        if (LOGGING_LogLevel < 1) {
          LastError();
          ErrorString_abi_cxx11_(0);
          local_a8 = 0;
          local_a0._M_local_buf[0] = '\0';
          _vb = (pointer)&local_a0;
          detail::stringPrintfRecursive<std::__cxx11::string>
                    ((string *)&vb,"socket() failed: %s",&local_90);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
              ,0x7c,_vb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_vb != &local_a0) {
            operator_delete(_vb,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                         local_a0._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        iVar1 = connect(iVar1,(sockaddr *)paVar3->ai_addr,paVar3->ai_addrlen);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
        if (*piVar2 == 0x6f) {
          if (LOGGING_LogLevel < 1) {
            Log(Verbose,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
                ,0x87,"Connection refused. Will try again...");
          }
        }
        else if (LOGGING_LogLevel < 1) {
          ErrorString_abi_cxx11_(0);
          local_a8 = 0;
          local_a0._M_local_buf[0] = '\0';
          _vb = (pointer)&local_a0;
          detail::stringPrintfRecursive<std::__cxx11::string>
                    ((string *)&vb,"connect() failed: %s",&local_90);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
              ,0x89,_vb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_vb != &local_a0) {
            operator_delete(_vb,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                         local_a0._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        close(this->socketFd);
        this->socketFd = -1;
      }
      paVar3 = paVar3->ai_next;
    } while (paVar3 != (addrinfo *)0x0);
  }
  freeaddrinfo((addrinfo *)addrinfo);
  if ((this->socketFd != -1) && (LOGGING_LogLevel < 1)) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp"
        ,0x95,"Connected to display server");
  }
  return;
}

Assistant:

void IPCChannel::Connect() {
    CHECK_EQ(socketFd, INVALID_SOCKET);

    LOG_VERBOSE("Trying to connect to display server");

    struct addrinfo hints = {}, *addrinfo;
    hints.ai_family = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;
    int err = getaddrinfo(address.c_str(), port.c_str(), &hints, &addrinfo);
    if (err)
        ErrorExit("%s", gai_strerror(err));

    socketFd = INVALID_SOCKET;
    for (struct addrinfo *ptr = addrinfo; ptr; ptr = ptr->ai_next) {
        socketFd = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
        if (socketFd == INVALID_SOCKET) {
            LOG_VERBOSE("socket() failed: %s", ErrorString());
            continue;
        }

        if (connect(socketFd, ptr->ai_addr, ptr->ai_addrlen) == SOCKET_ERROR) {
#ifdef PBRT_IS_WINDOWS
            int err = WSAGetLastError();
#else
            int err = errno;
#endif
            if (err == SocketError::ConnRefused)
                LOG_VERBOSE("Connection refused. Will try again...");
            else
                LOG_VERBOSE("connect() failed: %s", ErrorString(err));

            closeSocket(socketFd);
            socketFd = INVALID_SOCKET;
            continue;
        }

        break;  // success
    }

    freeaddrinfo(addrinfo);
    if (socketFd != INVALID_SOCKET)
        LOG_VERBOSE("Connected to display server");
}